

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void CommandLineParser::printUsage(void)

{
  char cVar1;
  ostream *poVar2;
  
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"NAME",4);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    clistats - Command line statistics tool",0x2b);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SYNOPSIS",8);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    clistats [-h] [-v <level>] [-V] [-i <file>] [-o <file>] [-a <code>] [-b]",0x4c);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "             [-c <character>] [-d <character>] [-fc <filter>] [-fn <filter>]",0x4c);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "             [-fs <filter>] [-k <rows>] [-r] [-rs <rows>] [-s <rows>]",0x45);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "             [-se <seed>] [-sr <step>] [-st] [-su <step>] [-t <row>] [-cr]",0x4a);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "             [-cv] [-fd] [-hg <bins>,[cache]] [-lo] [-ls] [-ss] < [file]",0x48);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DESCRIPTION",0xb);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    A command line tool to compute statistics for a stream of delimited input",0x4d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    numbers. It takes a stream of numbers from standard input or a redirected",0x4d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    file. To stop processing and display the statistics enter the EOF signal",0x4c);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    (CTRL-D on POSIX systems like Linux or Cygwin or CTRL-Z on Windows).",0x48);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    Alternatively, see the --blank option to use a blank row. The default",0x49);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    delimiter is a comma.",0x19);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    Delimited tokens that are not valid numeric values are skipped.",0x43);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    If any tokens are skipped then the resulting covariance and correlation",0x4b);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    are not exact and only a conservative overestimation.",0x39)
  ;
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    Note, all statistics are computed on a rolling basis and not by using the",0x4d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    entire dataset, so all non-order statistics are approximations.",0x43);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "    Displayed statistics use headers that start with # to enable piping",0x47);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    results to gnuplot.",0x17);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    Available statistics to display are:",0x28);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        - Count",0xf);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        - Minimum",0x11)
  ;
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        - Mean",0xe);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        - Maximum",0x11)
  ;
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        - Standard deviation",0x1c);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        - Covariance",0x14);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        - Correlation",0x15);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        - Least Squares Slope",0x1d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        - Least Squares Offset",0x1e);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        - Histogram",0x13);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OPTIONS",7);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    General options:",0x14);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -h",10);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        --help",0xe);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Print this help message",0x23);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -v <level>",0x12);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --verbose <level>",0x19);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Verbose level (0 to 5). Default = 0.",0x30);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -V",10);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        --version",0x11)
  ;
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Software version is displayed.",0x2a);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    I/O options:",0x10);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -i <file>",0x11)
  ;
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --input <file>",0x16);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Input file. Default is stdin.",0x29);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -o <file>",0x11)
  ;
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --output <file>",0x17);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Output file. Default is stdout.",0x2b);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        file",0xc);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Input file can be redirected as standard input",0x3a
            );
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    Parsing options:",0x14);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -a <code>",0x11)
  ;
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --ascii <code>",0x16);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Use delimiter character based on it\'s ASCII code (e.g., 9 = tab).",0x4d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Can be combined with \"-d\". Multiple delimiters will be",0x42);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            concatenated.",0x19);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -b",10);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        --blank",0xf);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Use blank row as the EOF signal to stop processing and display",0x4a);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            results. Default is CTRL-D for POSIX and CTRL-Z Windows.",0x44);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -c <character>",0x16);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --comment <character>",0x1d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Input comment character. Rows starting with this character will",0x4b);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            be skipped Default is no comments are recognized.",
             0x3d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -d <character>",0x16);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --delimiter <character>",0x1f);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Input delimiter character. Cannot be the same as the comment",0x48);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            character. Default = \",\". Multiple delimiters will be",0x41);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            concatenated.",0x19);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -fc <filter>",0x14);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --filterColumn",0x16);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Filter columns to process using comma delimited array of column",0x4b);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            indices to keep.",0x1c);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Format: \"<c1>,<c2>,...,<c3:c4>,...\"",0x2f);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                (e.g., \"1,2,3,5\" will discard column 4). Range of",0x41);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                columns can be indicated using \":\" (e.g., 1:3,5).",0x41);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -fn <filter>",0x14);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --filterNumeric <filter>",0x20);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Filter rows to process only those with a column matching a numeric",0x4e);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            criteria. Multiple filters can be used and will be processed in the",0x4f)
  ;
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            order the -fn flags are provided.",0x2d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Format: \"#,min,max,[a|r]\"",0x25);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                # = Number corresponding to column index to filter",0x42);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                min = Minimum numeric value (-inf for no minimum)",0x41);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                max = Maximum numeric value (inf for no maximum)",0x40);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                a|r = Optional letter to denote accept/reject filtering",0x47);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                      \"a\" denotes row is accepted if criteria is met",0x44);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                      \"r\" denotes row is rejected if criteria is met",0x44);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -fs <filter>",0x14);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --filterString <filter>",0x1f);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Filter rows to process only those with a column matching a string",0x4d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            match. Multiple filters can be used and will be processed in the",0x4c);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            order the -fs flags are provided.",0x2d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Format: \"#,p,[e|p],[s|i],[a|r]\"",0x2b);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                # = Number corresponding to column index to filter",0x42);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                p = String of pattern to match",0x2e);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                e|p = Optional letter to denote exact or partial match",0x46);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                s|i = Optional letter to denote case sensitive/insensitive",0x4a);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                a|r = Optional letter to denote accept/reject filtering",0x47);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                      \"a\" denotes row is accepted if criteria is met",0x44);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                      \"r\" denotes row is rejected if criteria is met",0x44);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -k <rows>",0x11)
  ;
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --keep <rows>",0x15);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Number of rows to keep after processing begins.",
             0x3b);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Default is to keep all.",0x23);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -r",10);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        --remove",0x10);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Remove duplicate sequential delimiters and treat them as one",0x48);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            delimiter. Default is to treat them separately.",
             0x3b);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -rs <rows>",0x12);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --reshape <rows>",0x18);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Reshape every N rows in a single column. Default = 1.",0x41);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -s <rows>",0x11)
  ;
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --skip <rows>",0x15);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Number of rows to skip before processing begins (e.g., header row)",0x4e);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Default = 0 (process all rows).",0x2b);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -se <seed>",0x12);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --seed <seed>",0x15);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Seed for random number generator when using \"-sr\" option.",0x45);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            <seed> can take values in the range [1,",0x33);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x7fffffff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"].",2);
  cVar1 = std::ios::widen((ios *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put(poVar2,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            If set to 0 then the current time is used as the seed.",0x42);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Default = 1.",0x18);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -sr <step>",0x12);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --samplerandom <step>",0x1d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Sample the rows to be processed randomly in intervals of given",0x4a);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            step size. One row is randomly chosen every \"step\" rows.",0x44);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Use \"-se\" to change the random number generator seed.",0x41);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Mutually exclusive with option \"-su\".",0x31);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -st",0xb);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        --strict",0x10);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Strictly enforce parsing to only accept rows with the same number",0x4d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            of tokens as the first successfully parsed row. Default is to",0x49);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            allow missing tokens.",0x21);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -su <step>",0x12);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --sampleuniform <step>",0x1e);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Sample the rows to be processed uniformly in intervals of given",0x4b);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            step size. Mutually exclusive with option \"-sr\".",
             0x3c);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -t <row>",0x10);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --titles <row>",0x16);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Row containing column header titles. If absent then index is used",0x4d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            for each column title.",0x22);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    Display options:",0x14);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -cr",0xb);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --correlation",0x15);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Show correlation of data.",0x25);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -cv",0xb);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --covariance",0x14);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Show covariance of data.",0x24);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -fd",0xb);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --filtered",0x12);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Show filtered data to be processed.",0x2f);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        -hg <bins>,[cache]",0x1a);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --histogram <bins>,[cache]",0x22);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Compute the histogram. Number of bins is required (Default = 100).",0x4e);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Cache size is optional and must be greater than 100"
             ,0x3f);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            (Default = 1000).",0x1d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -lo",0xb);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --lsqoffset",0x13);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Show least squares linear offset.",0x2d);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -ls",0xb);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --lsqslope",0x12);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            Show least squares linear slope.",0x2c);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        -ss",0xb);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"        --statistics",0x14);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            Show summary statistics. Enabled by default unless another display",0x4e);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            option is enabled.",0x1e);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EXIT STATUS",0xb);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    0 = Success",0xf);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    1 = Argument parsing failed",0x1f);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    2 = Computing statistics failed",0x23);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    3 = Displaying statistics failed",0x24);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BUGS",4);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  cVar1 = std::ios::widen((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put((ostream *)&std::cout,cVar1);
  std::ostream::flush(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    Report bugs to ",0x13);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      ApplicationProperties::AUTHOR_abi_cxx11_._M_dataplus._M_p,
                      ApplicationProperties::AUTHOR_abi_cxx11_._M_string_length);
  cVar1 = std::ios::widen((ios *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18)),'\n');
  poVar2 = (ostream *)std::ostream::put(poVar2,cVar1);
  std::ostream::flush(poVar2);
  return;
}

Assistant:

bool
    add(T const value)
    {
    
        if (!this->_enabled) return false;

        double dValue = (double) value;

        /* Add new data to cache if histogram is uninitialized or not within its bounds */
        if (!(this->_initialized & this->contains_(dValue)))
        {
            /* If cache is full then merge the cache and the histogram first */
            if (this->_cache.full())
            {
                this->merge();
            }

            /* Update cache if new value is not in merged histogram */
            if (!this->contains_(dValue))
            {
                this->_cache.add(dValue);
                return false;
            }
        }

        /* Add new data to existing histogram */
        this->add_(dValue);

        return true;

    }